

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
::~List_column(List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
               *this)

{
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
  *entry_00;
  bool bVar1;
  reference ppEVar2;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
  *entry;
  iterator __end0;
  iterator __begin0;
  Column_support *__range2;
  List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
  *this_local;
  
  __end0 = std::__cxx11::
           list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
           ::begin(&this->column_);
  entry = (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
           *)std::__cxx11::
             list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
             ::end(&this->column_);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&entry);
    if (!bVar1) break;
    ppEVar2 = std::
              _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>
              ::operator*(&__end0);
    entry_00 = *ppEVar2;
    Row_access<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>
    ::unlink(&this->super_Row_access_option,(char *)entry_00);
    New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_>
    ::destroy(this->entryPool_,entry_00);
    std::
    _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>
    ::operator++(&__end0);
  }
  std::__cxx11::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_false>_>_>_*>_>
  ::~list(&this->column_);
  return;
}

Assistant:

inline List_column<Master_matrix>::~List_column()
{
  for (auto* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::unlink(entry);
    entryPool_->destroy(entry);
  }
}